

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O2

int __thiscall RenX_ExtraLoggingPlugin::think(RenX_ExtraLoggingPlugin *this)

{
  tm *ptVar1;
  time_t current_time;
  string line;
  
  if ((this->file != (FILE *)0x0) && ((this->newDayFmt)._M_string_length != 0)) {
    current_time = time((time_t *)0x0);
    ptVar1 = localtime(&current_time);
    if (ptVar1->tm_yday != this->day) {
      this->day = ptVar1->tm_yday;
      std::__cxx11::string::string((string *)&line,&this->newDayFmt);
      RenX::processTags((string *)&line,(Server *)0x0,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                        (BuildingInfo *)0x0);
      fwrite(line._M_dataplus._M_p,1,line._M_string_length,(FILE *)this->file);
      fputs("\r\n",(FILE *)this->file);
      std::__cxx11::string::~string((string *)&line);
    }
  }
  return 0;
}

Assistant:

int RenX_ExtraLoggingPlugin::think() {
	if (RenX_ExtraLoggingPlugin::file != nullptr && !RenX_ExtraLoggingPlugin::newDayFmt.empty()) {
		time_t current_time = time(nullptr);
		int currentDay = localtime(&current_time)->tm_yday;
		if (currentDay != RenX_ExtraLoggingPlugin::day)
		{
			RenX_ExtraLoggingPlugin::day = currentDay;
			std::string line = RenX_ExtraLoggingPlugin::newDayFmt;
			RenX::processTags(line);
			fwrite(line.data(), sizeof(char), line.size(), file);
			fputs("\r\n", file);
		}
	}
	return 0;
}